

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O0

Aig_Obj_t * Aig_ManDupSimpleDfs_rec(Aig_Man_t *pNew,Aig_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *p1;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  Aig_Man_t *pNew_local;
  
  if ((pObj->field_5).pData == (void *)0x0) {
    pAVar2 = Aig_ObjFanin0(pObj);
    Aig_ManDupSimpleDfs_rec(pNew,p,pAVar2);
    iVar1 = Aig_ObjIsBuf(pObj);
    if (iVar1 == 0) {
      pAVar2 = Aig_ObjFanin1(pObj);
      Aig_ManDupSimpleDfs_rec(pNew,p,pAVar2);
      pAVar2 = Aig_ObjChild0Copy(pObj);
      p1 = Aig_ObjChild1Copy(pObj);
      pAVar2 = Aig_And(pNew,pAVar2,p1);
      (pObj->field_5).pData = pAVar2;
      pNew_local = (Aig_Man_t *)(pObj->field_5).pData;
    }
    else {
      pNew_local = (Aig_Man_t *)Aig_ObjChild0Copy(pObj);
      (pObj->field_5).pData = pNew_local;
    }
  }
  else {
    pNew_local = (Aig_Man_t *)(pObj->field_5).pData;
  }
  return (Aig_Obj_t *)pNew_local;
}

Assistant:

Aig_Obj_t * Aig_ManDupSimpleDfs_rec( Aig_Man_t * pNew, Aig_Man_t * p, Aig_Obj_t * pObj )
{
    if ( pObj->pData )
        return (Aig_Obj_t *)pObj->pData;
    Aig_ManDupSimpleDfs_rec( pNew, p, Aig_ObjFanin0(pObj) );
    if ( Aig_ObjIsBuf(pObj) )
        return (Aig_Obj_t *)(pObj->pData = Aig_ObjChild0Copy(pObj));
    Aig_ManDupSimpleDfs_rec( pNew, p, Aig_ObjFanin1(pObj) );
    pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    return (Aig_Obj_t *)pObj->pData;
}